

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_read_pclr_v2(opj_jp2_v2_t *jp2,uchar *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  opj_jp2_pclr_t *poVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uchar *p_buffer;
  ulong uVar9;
  OPJ_UINT32 l_value;
  uint local_48;
  uint local_44;
  uint *local_40;
  ulong local_38;
  
  if ((jp2->color).jp2_pclr != (opj_jp2_pclr_t *)0x0) {
    return 0;
  }
  opj_read_bytes_LE(p_pclr_header_data,&local_48,2);
  uVar8 = local_48 & 0xffff;
  local_44 = uVar8;
  opj_read_bytes_LE(p_pclr_header_data + 2,&local_48,1);
  uVar5 = local_48;
  p_buffer = p_pclr_header_data + 3;
  uVar9 = (ulong)(local_48 & 0xffff);
  puVar1 = (uint *)malloc((ulong)((local_48 & 0xffff) * uVar8) << 2);
  puVar2 = (uchar *)malloc(uVar9);
  puVar3 = (uchar *)malloc(uVar9);
  poVar4 = (opj_jp2_pclr_t *)malloc(0x28);
  poVar4->channel_sign = puVar3;
  poVar4->channel_size = puVar2;
  poVar4->entries = puVar1;
  poVar4->nr_entries = (unsigned_short)local_44;
  poVar4->nr_channels = (unsigned_short)uVar5;
  poVar4->cmap = (opj_jp2_cmap_comp_t *)0x0;
  (jp2->color).jp2_pclr = poVar4;
  local_40 = puVar1;
  local_38 = uVar9;
  if (uVar9 != 0) {
    uVar9 = 0;
    do {
      opj_read_bytes_LE(p_buffer + uVar9,&local_48,1);
      puVar2[uVar9] = ((byte)local_48 & 0x7f) + 1;
      puVar3[uVar9] = (byte)local_48 >> 7;
      uVar9 = uVar9 + 1;
    } while (local_38 != uVar9);
    p_buffer = p_buffer + uVar9;
  }
  if (local_44 != 0) {
    uVar9 = 0;
    uVar6 = local_38;
    puVar1 = local_40;
    do {
      local_40 = (uint *)uVar9;
      if ((int)uVar6 != 0) {
        lVar7 = 0;
        uVar9 = 0;
        do {
          opj_read_bytes_LE(p_buffer,&local_48,(uint)(puVar2[uVar9] >> 3));
          p_buffer = p_buffer + (puVar2[uVar9] >> 3);
          puVar1[uVar9] = local_48;
          uVar9 = uVar9 + 1;
          lVar7 = lVar7 + -4;
        } while (local_38 != uVar9);
        puVar1 = (uint *)((long)puVar1 - lVar7);
        uVar6 = local_38;
      }
      uVar5 = (int)local_40 + 1;
      uVar9 = (ulong)uVar5;
    } while (uVar5 != local_44);
  }
  return 1;
}

Assistant:

opj_bool jp2_read_pclr_v2(	opj_jp2_v2_t *jp2,
							unsigned char * p_pclr_header_data,
							OPJ_UINT32 p_pclr_header_size,
							opj_event_mgr_t * p_manager
						  ){
	opj_jp2_pclr_t *jp2_pclr;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	OPJ_UINT16 nr_entries,nr_channels;
	OPJ_UINT16 i, j;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(p_pclr_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if(jp2->color.jp2_pclr)
		return OPJ_FALSE;

	opj_read_bytes(p_pclr_header_data, &l_value , 2);	/* NE */
	p_pclr_header_data += 2;
	nr_entries = (OPJ_UINT16) l_value;

	opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* NPC */
	++p_pclr_header_data;
	nr_channels = (OPJ_UINT16) l_value;

	entries = (OPJ_UINT32*) opj_malloc(nr_channels * nr_entries * sizeof(OPJ_UINT32));
	channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
	channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);

	jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
	jp2_pclr->channel_sign = channel_sign;
	jp2_pclr->channel_size = channel_size;
	jp2_pclr->entries = entries;
	jp2_pclr->nr_entries = nr_entries;
	jp2_pclr->nr_channels = nr_channels;
	jp2_pclr->cmap = NULL;

	jp2->color.jp2_pclr = jp2_pclr;

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* Bi */
		++p_pclr_header_data;

		channel_size[i] = (l_value & 0x7f) + 1;
		channel_sign[i] = (l_value & 0x80)? 1 : 0;
	}

	for(j = 0; j < nr_entries; ++j) {
		for(i = 0; i < nr_channels; ++i) {
			/**entries++ = cio_read(cio, channel_size[i]>>3); */
			opj_read_bytes(p_pclr_header_data, &l_value , channel_size[i]>>3);	/* Cji */
			p_pclr_header_data += channel_size[i]>>3;
			*entries = (OPJ_UINT32) l_value;
			entries++;
		}
	}

	return OPJ_TRUE;
}